

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_ntlm.c
# Opt level: O1

CURLcode Curl_output_ntlm(connectdata *conn,_Bool proxy)

{
  uchar *puVar1;
  long lVar2;
  byte *pbVar3;
  Curl_easy *pCVar4;
  char *hostname;
  char **ppcVar5;
  proxy_info *ppVar6;
  CURLcode CVar7;
  ntlmdata *ntlm;
  char *pcVar8;
  char *service;
  char *passwdp;
  int iVar9;
  undefined7 in_register_00000031;
  char *userp;
  char **ppcVar10;
  ulong uVar11;
  ulong uVar12;
  char *pcVar13;
  long lVar14;
  bool bVar15;
  char *base64;
  long local_40;
  size_t len;
  
  iVar9 = (int)CONCAT71(in_register_00000031,proxy);
  base64 = (char *)0x0;
  len = 0;
  pCVar4 = conn->data;
  uVar12 = (ulong)(uint)(iVar9 << 5);
  ppcVar5 = &(conn->http_proxy).user;
  ppcVar10 = &(conn->http_proxy).passwd;
  bVar15 = iVar9 != 0;
  lVar14 = 0x420;
  if (bVar15) {
    lVar14 = 0x408;
  }
  uVar11 = CONCAT71(in_register_00000031,proxy) & 0xffffffff;
  if (!bVar15) {
    ppcVar10 = &conn->passwd;
    ppcVar5 = &conn->user;
  }
  lVar2 = uVar11 * 4;
  local_40 = lVar2 + 0x488;
  pcVar8 = (pCVar4->set).str[(ulong)!proxy + 0x35];
  ppVar6 = &conn->http_proxy;
  if (!bVar15) {
    ppVar6 = (proxy_info *)&conn->host;
  }
  ntlm = (ntlmdata *)((conn->ntlm).nonce + (uVar12 - 4));
  passwdp = *ppcVar10;
  userp = *ppcVar5;
  hostname = (ppVar6->host).name;
  pbVar3 = &(pCVar4->state).authhost.field_0x18 + uVar12;
  *pbVar3 = *pbVar3 & 0xfe;
  pcVar13 = "";
  if (userp == (char *)0x0) {
    userp = "";
  }
  if (passwdp == (char *)0x0) {
    passwdp = "";
  }
  iVar9 = *(int *)((conn->ntlm).nonce + uVar11 * 4 + -0xc);
  if (iVar9 == 2) {
    CVar7 = Curl_auth_create_ntlm_type3_message(conn->data,userp,passwdp,ntlm,&base64,&len);
    if (CVar7 != CURLE_OK) {
      return CVar7;
    }
    if (base64 == (char *)0x0) {
      return CURLE_OK;
    }
    (*Curl_cfree)(*(void **)((conn->chunk).hexbuffer + lVar14 + -0x20));
    if (proxy) {
      pcVar13 = "Proxy-";
    }
    pcVar8 = curl_maprintf("%sAuthorization: NTLM %s\r\n",pcVar13,base64);
    *(char **)((conn->chunk).hexbuffer + lVar14 + -0x20) = pcVar8;
    (*Curl_cfree)(base64);
    if (*(long *)((conn->chunk).hexbuffer + lVar14 + -0x20) == 0) {
      return CURLE_OUT_OF_MEMORY;
    }
    pcVar8 = (conn->chunk).hexbuffer + local_40 + -0x20;
    pcVar8[0] = '\x03';
    pcVar8[1] = '\0';
    pcVar8[2] = '\0';
    pcVar8[3] = '\0';
  }
  else {
    if (iVar9 == 3) {
      puVar1 = (conn->ntlm).nonce + lVar2 + -0xc;
      puVar1[0] = '\x04';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
    }
    else if (iVar9 != 4) {
      service = "HTTP";
      if (pcVar8 != (char *)0x0) {
        service = pcVar8;
      }
      CVar7 = Curl_auth_create_ntlm_type1_message
                        (conn->data,userp,passwdp,service,hostname,ntlm,&base64,&len);
      if (CVar7 != CURLE_OK) {
        return CVar7;
      }
      if (base64 == (char *)0x0) {
        return CURLE_OK;
      }
      (*Curl_cfree)(*(void **)((conn->chunk).hexbuffer + lVar14 + -0x20));
      if (proxy) {
        pcVar13 = "Proxy-";
      }
      pcVar8 = curl_maprintf("%sAuthorization: NTLM %s\r\n",pcVar13,base64);
      *(char **)((conn->chunk).hexbuffer + lVar14 + -0x20) = pcVar8;
      (*Curl_cfree)(base64);
      if (*(long *)((conn->chunk).hexbuffer + lVar14 + -0x20) != 0) {
        return CURLE_OK;
      }
      return CURLE_OUT_OF_MEMORY;
    }
    (*Curl_cfree)(*(void **)((conn->chunk).hexbuffer + lVar14 + -0x20));
    pcVar8 = (conn->chunk).hexbuffer + lVar14 + -0x20;
    pcVar8[0] = '\0';
    pcVar8[1] = '\0';
    pcVar8[2] = '\0';
    pcVar8[3] = '\0';
    pcVar8[4] = '\0';
    pcVar8[5] = '\0';
    pcVar8[6] = '\0';
    pcVar8[7] = '\0';
  }
  pbVar3 = &(pCVar4->state).authhost.field_0x18 + uVar12;
  *pbVar3 = *pbVar3 | 1;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_output_ntlm(struct connectdata *conn, bool proxy)
{
  char *base64 = NULL;
  size_t len = 0;
  CURLcode result;

  /* point to the address of the pointer that holds the string to send to the
     server, which is for a plain host or for a HTTP proxy */
  char **allocuserpwd;

  /* point to the username, password, service and host */
  const char *userp;
  const char *passwdp;
  const char *service = NULL;
  const char *hostname = NULL;

  /* point to the correct struct with this */
  struct ntlmdata *ntlm;
  curlntlm *state;
  struct auth *authp;

  DEBUGASSERT(conn);
  DEBUGASSERT(conn->data);

#if defined(NTLM_NEEDS_NSS_INIT)
  if(CURLE_OK != Curl_nss_force_init(conn->data))
    return CURLE_OUT_OF_MEMORY;
#endif

  if(proxy) {
    allocuserpwd = &conn->allocptr.proxyuserpwd;
    userp = conn->http_proxy.user;
    passwdp = conn->http_proxy.passwd;
    service = conn->data->set.str[STRING_PROXY_SERVICE_NAME] ?
              conn->data->set.str[STRING_PROXY_SERVICE_NAME] : "HTTP";
    hostname = conn->http_proxy.host.name;
    ntlm = &conn->proxyntlm;
    state = &conn->proxy_ntlm_state;
    authp = &conn->data->state.authproxy;
  }
  else {
    allocuserpwd = &conn->allocptr.userpwd;
    userp = conn->user;
    passwdp = conn->passwd;
    service = conn->data->set.str[STRING_SERVICE_NAME] ?
              conn->data->set.str[STRING_SERVICE_NAME] : "HTTP";
    hostname = conn->host.name;
    ntlm = &conn->ntlm;
    state = &conn->http_ntlm_state;
    authp = &conn->data->state.authhost;
  }
  authp->done = FALSE;

  /* not set means empty */
  if(!userp)
    userp = "";

  if(!passwdp)
    passwdp = "";

#ifdef USE_WINDOWS_SSPI
  if(s_hSecDll == NULL) {
    /* not thread safe and leaks - use curl_global_init() to avoid */
    CURLcode err = Curl_sspi_global_init();
    if(s_hSecDll == NULL)
      return err;
  }
#ifdef SECPKG_ATTR_ENDPOINT_BINDINGS
  ntlm->sslContext = conn->sslContext;
#endif
#endif

  switch(*state) {
  case NTLMSTATE_TYPE1:
  default: /* for the weird cases we (re)start here */
    /* Create a type-1 message */
    result = Curl_auth_create_ntlm_type1_message(conn->data, userp, passwdp,
                                                 service, hostname,
                                                 ntlm, &base64,
                                                 &len);
    if(result)
      return result;

    if(base64) {
      free(*allocuserpwd);
      *allocuserpwd = aprintf("%sAuthorization: NTLM %s\r\n",
                              proxy ? "Proxy-" : "",
                              base64);
      free(base64);
      if(!*allocuserpwd)
        return CURLE_OUT_OF_MEMORY;

      DEBUG_OUT(fprintf(stderr, "**** Header %s\n ", *allocuserpwd));
    }
    break;

  case NTLMSTATE_TYPE2:
    /* We already received the type-2 message, create a type-3 message */
    result = Curl_auth_create_ntlm_type3_message(conn->data, userp, passwdp,
                                                 ntlm, &base64, &len);
    if(result)
      return result;

    if(base64) {
      free(*allocuserpwd);
      *allocuserpwd = aprintf("%sAuthorization: NTLM %s\r\n",
                              proxy ? "Proxy-" : "",
                              base64);
      free(base64);
      if(!*allocuserpwd)
        return CURLE_OUT_OF_MEMORY;

      DEBUG_OUT(fprintf(stderr, "**** %s\n ", *allocuserpwd));

      *state = NTLMSTATE_TYPE3; /* we send a type-3 */
      authp->done = TRUE;
    }
    break;

  case NTLMSTATE_TYPE3:
    /* connection is already authenticated,
     * don't send a header in future requests */
    *state = NTLMSTATE_LAST;
    /* FALLTHROUGH */
  case NTLMSTATE_LAST:
    Curl_safefree(*allocuserpwd);
    authp->done = TRUE;
    break;
  }

  return CURLE_OK;
}